

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *this_00;
  StreamBuf<char> *pSVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  undefined7 extraout_var;
  long lVar8;
  long lVar9;
  char *pcVar10;
  Type type;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  uint unaff_R12D;
  uint uVar14;
  int iVar15;
  int unaff_R14D;
  byte *pbVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auStack_208 [8];
  GroupType groupRef;
  undefined1 auStack_c8 [8];
  GroupSet groupSet;
  Visitor visitor;
  
  this_00 = context->cursor;
  pSVar1 = this_00->buf;
  if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
     (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
    bVar17 = false;
  }
  else {
    pSVar1 = this_00->buf;
    pbVar16 = *(byte **)&pSVar1->field_0x10;
    lVar6 = *(long *)&pSVar1->field_0x18 - (long)pbVar16;
    if (lVar6 == 0) {
      lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
    }
    sVar11 = 0;
    unaff_R14D = 0;
    do {
      if ((byte)(*pbVar16 - 0x30) < 10) {
        unaff_R14D = (uint)*pbVar16 + unaff_R14D * 10 + -0x30;
        sVar11 = sVar11 + 1;
        lVar6 = lVar6 + -1;
        bVar17 = lVar6 != 0;
      }
      else {
        bVar17 = false;
      }
      pbVar16 = pbVar16 + 1;
    } while (bVar17);
    bVar17 = sVar11 != 0;
    if (bVar17) {
      StreamCursor::advance(this_00,sVar11);
      bVar17 = true;
    }
  }
  if (!bVar17) {
    pSVar1 = this_00->buf;
    if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
       (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
      uVar13 = 0x3f;
    }
    else {
      pSVar1 = this_00->buf;
      if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
        cVar5 = **(char **)&pSVar1->field_0x10;
      }
      else {
        cVar5 = (**(code **)(*(long *)pSVar1 + 0x48))();
      }
      uVar13 = (ulong)(uint)(int)cVar5;
    }
    ParsingContext::setError
              (context,ParsingError,
               "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",
               0x180,uVar13);
    return;
  }
  bVar17 = StreamCursor::advance(this_00,1);
  if (unaff_R14D == 0) {
    if (!bVar17) {
      pcVar10 = "Got early EOF after tag %d value";
      goto LAB_008e2790;
    }
  }
  else {
    if (!bVar17) {
      pcVar10 = "Expected RepeatingGroup %d, got EOF";
LAB_008e2790:
      ParsingContext::setError(context,Incomplete,pcVar10,0x180);
      return;
    }
    if ((ulong)(((long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.CapacityX -
                 (long)(field->values).
                       super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       .
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                       .super_SmallVectorBase.BeginX >> 3) * 0x6f96f96f96f96f97) <
        (ulong)(long)unaff_R14D) {
      llvm::
      SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
      ::grow((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
              *)field,(long)unaff_R14D);
    }
    groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
    groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
    groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
    groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
    auStack_c8 = (undefined1  [8])0x0;
    groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
    groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
    bVar17 = true;
    do {
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .allBits.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)
           ((long)&groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                   .unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                   .super_SmallVectorBase + 0x10);
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.value.
      m_view.second = 0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .values.base.
      super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_false>.value.
      m_view.first = (char *)0x0;
      auStack_208 = (undefined1  [8])0x0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .values.base.
      super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.value.
      m_view.first = (char *)0x0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      ._32_8_ = 0;
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX =
           (void *)((long)groupRef.
                          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                          .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer +
                   0x10);
      groupRef.
      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
      .unparsed.
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
      .
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX =
           (void *)groupRef.
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                   .allBits.super__Base_bitset<1UL>._M_w;
      bVar4 = bVar17;
      do {
        pSVar1 = this_00->buf;
        uVar2 = *(undefined8 *)&pSVar1->field_0x8;
        lVar6 = *(long *)&pSVar1->field_0x10;
        lVar3 = *(long *)&pSVar1->field_0x18;
        if ((lVar3 == lVar6) && (lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar7 == 0)) {
          bVar18 = false;
          lVar7 = 0;
        }
        else {
          pSVar1 = this_00->buf;
          pbVar16 = *(byte **)&pSVar1->field_0x10;
          lVar7 = *(long *)&pSVar1->field_0x18 - (long)pbVar16;
          if (lVar7 == 0) {
            lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))();
          }
          sVar11 = 0;
          uVar14 = 0;
          do {
            if ((byte)(*pbVar16 - 0x30) < 10) {
              uVar14 = ((uint)*pbVar16 + uVar14 * 10) - 0x30;
              sVar11 = sVar11 + 1;
              lVar7 = lVar7 + -1;
              bVar17 = lVar7 != 0;
            }
            else {
              bVar17 = false;
            }
            pbVar16 = pbVar16 + 1;
          } while (bVar17);
          bVar18 = sVar11 != 0;
          if (bVar18) {
            bVar18 = true;
            bVar17 = StreamCursor::advance(this_00,sVar11);
            lVar7 = CONCAT71(extraout_var,bVar17);
            unaff_R12D = uVar14;
          }
        }
        bVar17 = bVar4;
        if (bVar18) {
          lVar9 = 1;
          lVar8 = 0;
          do {
            if (lVar9 < lVar8) {
              lVar12 = -1;
              break;
            }
            lVar12 = (lVar9 + lVar8) / 2;
            uVar14 = details::
                     IndexesImpl<meta::pack::Pack<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                     ::Sorted.arr[lVar12];
            if (uVar14 != unaff_R12D) {
              if ((int)uVar14 < (int)unaff_R12D) {
                lVar8 = lVar12 + 1;
                lVar12 = lVar7;
              }
              else {
                lVar9 = lVar12 + -1;
                lVar12 = lVar7;
              }
            }
            lVar7 = lVar12;
          } while (uVar14 != unaff_R12D);
          if (lVar12 == -1) {
            lVar9 = 6;
            lVar8 = 0;
            lVar7 = -1;
            do {
              if (lVar9 < lVar8) {
                lVar12 = -1;
                break;
              }
              lVar12 = (lVar9 + lVar8) / 2;
              uVar14 = details::
                       IndexesImpl<meta::pack::Pack<Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                       ::Sorted.arr[lVar12];
              if (uVar14 != unaff_R12D) {
                if ((int)uVar14 < (int)unaff_R12D) {
                  lVar8 = lVar12 + 1;
                  lVar12 = lVar7;
                }
                else {
                  lVar9 = lVar12 + -1;
                  lVar12 = lVar7;
                }
              }
              lVar7 = lVar12;
            } while (uVar14 != unaff_R12D);
            iVar15 = 10;
            bVar18 = true;
            bVar17 = false;
            if ((lVar12 == -1) && (bVar17 = false, unaff_R12D != 10)) {
              bVar17 = StreamCursor::advance(this_00,1);
              pcVar10 = "Expected value after tag %d, got EOF";
              if (!bVar17) goto LAB_008e2543;
              lVar7 = *(long *)&this_00->buf->field_0x8;
              lVar9 = *(long *)&this_00->buf->field_0x10;
              while( true ) {
                pSVar1 = this_00->buf;
                if (*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) {
                  lVar8 = (**(code **)(*(long *)pSVar1 + 0x38))();
                  bVar17 = lVar8 == 0;
                }
                else {
                  bVar17 = false;
                }
                iVar15 = 1;
                if (bVar17) {
                  type = ParsingError;
                  pcVar10 = "Expected value after tag %d, got EOF";
                  goto LAB_008e258a;
                }
                pSVar1 = this_00->buf;
                if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
                  cVar5 = **(char **)&pSVar1->field_0x10;
                }
                else {
                  cVar5 = (**(code **)(*(long *)pSVar1 + 0x48))();
                }
                if (cVar5 == '|') break;
                StreamCursor::advance(this_00,1);
              }
              if (strict) {
                bVar18 = false;
                ParsingContext::setError
                          (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",
                           (ulong)unaff_R12D,0x180);
                bVar17 = bVar4;
              }
              else {
                if (!skipUnknown) {
                  lVar8 = *(long *)&this_00->buf->field_0x10;
                  lVar12 = *(long *)&this_00->buf->field_0x8;
                  if (groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                      .super_SmallVectorBase.EndX <=
                      groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                      .super_SmallVectorBase.BeginX) {
                    llvm::
                    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                            *)&groupRef.
                               super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                               .allBits,0);
                  }
                  *(uint *)groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                           .unparsed.
                           super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                           .
                           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                           .super_SmallVectorBase.BeginX = unaff_R12D;
                  *(long *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 8) = lVar9;
                  *(long *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 0x10) =
                       (lVar7 + lVar8) - (lVar12 + lVar9);
                  groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX =
                       (void *)((long)groupRef.
                                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                      .unparsed.
                                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                                      .
                                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                      .
                                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                      .super_SmallVectorBase.BeginX + 0x18);
                }
                bVar17 = StreamCursor::advance(this_00,1);
                type = Incomplete;
                if (bVar17) {
                  iVar15 = 0xb;
                  goto LAB_008e2490;
                }
                pcVar10 = "Got early EOF after tag %d value";
LAB_008e258a:
                bVar18 = false;
                ParsingContext::setError(context,type,pcVar10,(ulong)unaff_R12D);
                bVar17 = bVar4;
              }
            }
          }
          else {
            bVar18 = std::bitset<386UL>::test((bitset<386UL> *)auStack_c8,(ulong)unaff_R12D);
            if (bVar18) {
              iVar15 = 10;
              bVar18 = true;
            }
            else {
              bVar17 = StreamCursor::advance(this_00,1);
              pcVar10 = "Expected value after Tag %d, got EOF";
              if (bVar17) {
                TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                ::set((TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                       *)auStack_c8,unaff_R12D);
                groupSet.bits.super__Base_bitset<7UL>._M_w[6]._0_1_ = '\0';
                doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>::Visitor,0ul,1ul>
                          (auStack_208,unaff_R12D,groupSet.bits.super__Base_bitset<7UL>._M_w + 6);
                iVar15 = 0;
                if (((char)groupSet.bits.super__Base_bitset<7UL>._M_w[6] == '\0') &&
                   (bVar17 = StreamCursor::advance(this_00,1), !bVar17)) {
                  iVar15 = 1;
                  ParsingContext::setError
                            (context,Incomplete,"Got early EOF in RepeatingGroup %d",0x180);
                }
LAB_008e2490:
                bVar18 = false;
                bVar17 = bVar4;
              }
              else {
LAB_008e2543:
                iVar15 = 1;
                bVar18 = false;
                ParsingContext::setError(context,Incomplete,pcVar10,(ulong)unaff_R12D);
                bVar17 = bVar4;
              }
            }
          }
        }
        else {
          pSVar1 = this_00->buf;
          if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
             (lVar7 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar7 == 0)) {
            cVar5 = '?';
          }
          else {
            pSVar1 = this_00->buf;
            if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
              cVar5 = **(char **)&pSVar1->field_0x10;
            }
            else {
              cVar5 = (**(code **)(*(long *)pSVar1 + 0x48))();
            }
          }
          iVar15 = 1;
          bVar18 = true;
          ParsingContext::setError
                    (context,ParsingError,
                     "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x180,
                     (ulong)(uint)(int)cVar5);
        }
        if (bVar18) {
          pSVar1 = this_00->buf;
          *(undefined8 *)&pSVar1->field_0x8 = uVar2;
          *(long *)&pSVar1->field_0x10 = lVar6;
          *(long *)&pSVar1->field_0x18 = lVar3;
        }
        bVar4 = bVar17;
      } while ((iVar15 == 0) || (iVar15 == 0xb));
      if (iVar15 == 10) {
        llvm::
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
        ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                     *)field,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                              *)auStack_208);
        groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
        auStack_c8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
      }
      if (groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .allBits.super__Base_bitset<1UL>._M_w !=
          (_Base_bitset<1UL>)
          ((long)&groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                  .super_SmallVectorBase + 0x10U)) {
        free((void *)groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                     .allBits.super__Base_bitset<1UL>._M_w);
      }
    } while ((iVar15 == 10) && (bVar17));
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }